

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonRenderNode(JsonNode *pNode,JsonString *pOut,sqlite3_value **aReplace)

{
  JsonNode *pJVar1;
  int iVar2;
  uint uVar3;
  u32 N;
  ulong uVar4;
  char c;
  char *zIn;
  
  if ((pNode->jnFlags & 0x18) != 0) {
    if (aReplace != (sqlite3_value **)0x0 && (pNode->jnFlags & 8) != 0) {
      jsonAppendValue(pOut,aReplace[(pNode->u).iAppend]);
      return;
    }
    pNode = (pNode->u).pPatch;
  }
  switch(pNode->eType) {
  case '\x01':
    zIn = "true";
    break;
  case '\x02':
    zIn = "false";
    N = 5;
    goto LAB_001bf0ac;
  case '\x05':
    if ((pNode->jnFlags & 1) != 0) {
      jsonAppendString(pOut,(pNode->u).zJContent,pNode->n);
      return;
    }
  case '\x03':
  case '\x04':
    zIn = (pNode->u).zJContent;
    N = pNode->n;
    goto LAB_001bf0ac;
  case '\x06':
    jsonAppendChar(pOut,'[');
    while( true ) {
      if (pNode->n != 0) {
        uVar4 = 1;
        do {
          pJVar1 = pNode + uVar4;
          if ((pNode[uVar4].jnFlags & 4) == 0) {
            if ((pOut->nUsed != 0) && ((pOut->zBuf[pOut->nUsed - 1] & 0xdfU) != 0x5b)) {
              jsonAppendChar(pOut,',');
            }
            jsonRenderNode(pJVar1,pOut,aReplace);
          }
          iVar2 = 1;
          if (5 < pJVar1->eType) {
            iVar2 = pJVar1->n + 1;
          }
          uVar3 = (int)uVar4 + iVar2;
          uVar4 = (ulong)uVar3;
        } while (uVar3 <= pNode->n);
      }
      if ((pNode->jnFlags & 0x20) == 0) break;
      pNode = pNode + (pNode->u).iAppend;
    }
    c = ']';
    goto LAB_001bf221;
  case '\a':
    jsonAppendChar(pOut,'{');
    while( true ) {
      if (pNode->n != 0) {
        uVar3 = 1;
        do {
          pJVar1 = pNode + (uVar3 + 1);
          if ((pNode[uVar3 + 1].jnFlags & 4) == 0) {
            if ((pOut->nUsed != 0) && ((pOut->zBuf[pOut->nUsed - 1] & 0xdfU) != 0x5b)) {
              jsonAppendChar(pOut,',');
            }
            jsonRenderNode(pNode + uVar3,pOut,aReplace);
            jsonAppendChar(pOut,':');
            jsonRenderNode(pJVar1,pOut,aReplace);
          }
          iVar2 = 2;
          if (5 < pJVar1->eType) {
            iVar2 = pJVar1->n + 2;
          }
          uVar3 = iVar2 + uVar3;
        } while (uVar3 <= pNode->n);
      }
      if ((pNode->jnFlags & 0x20) == 0) break;
      pNode = pNode + (pNode->u).iAppend;
    }
    c = '}';
LAB_001bf221:
    jsonAppendChar(pOut,c);
    return;
  default:
    zIn = "null";
  }
  N = 4;
LAB_001bf0ac:
  jsonAppendRaw(pOut,zIn,N);
  return;
}

Assistant:

static void jsonRenderNode(
  JsonNode *pNode,               /* The node to render */
  JsonString *pOut,              /* Write JSON here */
  sqlite3_value **aReplace       /* Replacement values */
){
  assert( pNode!=0 );
  if( pNode->jnFlags & (JNODE_REPLACE|JNODE_PATCH) ){
    if( (pNode->jnFlags & JNODE_REPLACE)!=0 && ALWAYS(aReplace!=0) ){
      assert( pNode->eU==4 );
      jsonAppendValue(pOut, aReplace[pNode->u.iReplace]);
      return;
    }
    assert( pNode->eU==5 );
    pNode = pNode->u.pPatch;
  }
  switch( pNode->eType ){
    default: {
      assert( pNode->eType==JSON_NULL );
      jsonAppendRaw(pOut, "null", 4);
      break;
    }
    case JSON_TRUE: {
      jsonAppendRaw(pOut, "true", 4);
      break;
    }
    case JSON_FALSE: {
      jsonAppendRaw(pOut, "false", 5);
      break;
    }
    case JSON_STRING: {
      if( pNode->jnFlags & JNODE_RAW ){
        assert( pNode->eU==1 );
        jsonAppendString(pOut, pNode->u.zJContent, pNode->n);
        break;
      }
      /* no break */ deliberate_fall_through
    }
    case JSON_REAL:
    case JSON_INT: {
      assert( pNode->eU==1 );
      jsonAppendRaw(pOut, pNode->u.zJContent, pNode->n);
      break;
    }
    case JSON_ARRAY: {
      u32 j = 1;
      jsonAppendChar(pOut, '[');
      for(;;){
        while( j<=pNode->n ){
          if( (pNode[j].jnFlags & JNODE_REMOVE)==0 ){
            jsonAppendSeparator(pOut);
            jsonRenderNode(&pNode[j], pOut, aReplace);
          }
          j += jsonNodeSize(&pNode[j]);
        }
        if( (pNode->jnFlags & JNODE_APPEND)==0 ) break;
        assert( pNode->eU==2 );
        pNode = &pNode[pNode->u.iAppend];
        j = 1;
      }
      jsonAppendChar(pOut, ']');
      break;
    }
    case JSON_OBJECT: {
      u32 j = 1;
      jsonAppendChar(pOut, '{');
      for(;;){
        while( j<=pNode->n ){
          if( (pNode[j+1].jnFlags & JNODE_REMOVE)==0 ){
            jsonAppendSeparator(pOut);
            jsonRenderNode(&pNode[j], pOut, aReplace);
            jsonAppendChar(pOut, ':');
            jsonRenderNode(&pNode[j+1], pOut, aReplace);
          }
          j += 1 + jsonNodeSize(&pNode[j+1]);
        }
        if( (pNode->jnFlags & JNODE_APPEND)==0 ) break;
        assert( pNode->eU==2 );
        pNode = &pNode[pNode->u.iAppend];
        j = 1;
      }
      jsonAppendChar(pOut, '}');
      break;
    }
  }
}